

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os.c
# Opt level: O0

void print_timerepr(FILE *f,TimeRepr *repr)

{
  TimeRepr *repr_local;
  FILE *f_local;
  
  if (0 < repr->days) {
    fprintf((FILE *)f,"%d day(s), ",(ulong)(uint)repr->days);
  }
  if (0 < repr->hours) {
    fprintf((FILE *)f,"%d hour(s), ",(ulong)(uint)repr->hours);
  }
  if (0 < repr->minutes) {
    fprintf((FILE *)f,"%d minute(s), ",(ulong)(uint)repr->minutes);
  }
  if (0 < repr->seconds) {
    fprintf((FILE *)f,"%d second(s), ",(ulong)(uint)repr->seconds);
  }
  if (0 < repr->milliseconds) {
    fprintf((FILE *)f,"%d msec(s), ",(ulong)(uint)repr->milliseconds);
  }
  if (0 < repr->microseconds) {
    fprintf((FILE *)f,"%d usec(s)",(ulong)(uint)repr->microseconds);
  }
  return;
}

Assistant:

void print_timerepr(FILE *f, const TimeRepr *repr) {
    if (repr->days > 0) {
        fprintf(f, "%d day(s), ", repr->days);
    }

    if (repr->hours > 0) {
        fprintf(f, "%d hour(s), ", repr->hours);
    }

    if (repr->minutes > 0) {
        fprintf(f, "%d minute(s), ", repr->minutes);
    }

    if (repr->seconds > 0) {
        fprintf(f, "%d second(s), ", repr->seconds);
    }

    if (repr->milliseconds > 0) {
        fprintf(f, "%d msec(s), ", repr->milliseconds);
    }

    if (repr->microseconds > 0) {
        fprintf(f, "%d usec(s)", repr->microseconds);
    }
}